

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_> __thiscall
pbrt::BDPTIntegrator::Create
          (BDPTIntegrator *this,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool visualizeStrategies;
  bool visualizeWeights;
  int maxDepth;
  string lightStrategy;
  string local_90;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_70;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_68;
  SamplerHandle *local_60;
  SamplerHandle *local_58;
  bool regularize;
  undefined7 uStack_4f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &lightStrategy.field_2;
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  local_60 = (SamplerHandle *)camera;
  local_58 = sampler;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"maxdepth","");
  maxDepth = ParameterDictionary::GetOneInt(parameters,&lightStrategy,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"visualizestrategies","")
  ;
  visualizeStrategies = ParameterDictionary::GetOneBool(parameters,&lightStrategy,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"visualizeweights","");
  visualizeWeights = ParameterDictionary::GetOneBool(parameters,&lightStrategy,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  local_70 = (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)aggregate;
  local_68 = lights;
  if (visualizeStrategies == false) {
    if (!visualizeWeights || maxDepth < 6) goto LAB_0040773f;
  }
  else if (maxDepth < 6) goto LAB_0040773f;
  Warning(loc,"visualizestrategies/visualizeweights was enabled, limiting maxdepth to 5");
  maxDepth = 5;
LAB_0040773f:
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"lightsampler","");
  _regularize = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&regularize,"power","");
  ParameterDictionary::GetOneString(&lightStrategy,parameters,&local_90,(string *)&regularize);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_regularize != &local_40) {
    operator_delete(_regularize,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"regularize","");
  bVar2 = ParameterDictionary::GetOneBool(parameters,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  regularize = bVar2;
  std::
  make_unique<pbrt::BDPTIntegrator,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,int&,bool&,bool&,std::__cxx11::string&,bool&>
            ((CameraHandle *)this,local_60,(PrimitiveHandle *)local_58,local_70,(int *)local_68,
             (bool *)&maxDepth,&visualizeStrategies,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&visualizeWeights,
             (bool *)&lightStrategy);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != &lightStrategy.field_2) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BDPTIntegrator> BDPTIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    bool visualizeStrategies = parameters.GetOneBool("visualizestrategies", false);
    bool visualizeWeights = parameters.GetOneBool("visualizeweights", false);

    if ((visualizeStrategies || visualizeWeights) && maxDepth > 5) {
        Warning(loc, "visualizestrategies/visualizeweights was enabled, limiting "
                     "maxdepth to 5");
        maxDepth = 5;
    }

    std::string lightStrategy = parameters.GetOneString("lightsampler", "power");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<BDPTIntegrator>(camera, sampler, aggregate, lights, maxDepth,
                                            visualizeStrategies, visualizeWeights,
                                            lightStrategy, regularize);
}